

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void ReadArray<aiVectorKey>(IOStream *stream,aiVectorKey *out,uint size)

{
  double dVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  undefined8 local_38;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVectorKey]");
  }
  if (out != (aiVectorKey *)0x0) {
    if (size != 0) {
      lVar2 = 0;
      do {
        dVar1 = Read<double>(stream);
        fVar3 = Read<float>(stream);
        fVar4 = Read<float>(stream);
        local_38 = CONCAT44(fVar4,fVar3);
        fVar3 = Read<float>(stream);
        *(double *)((long)&out->mTime + lVar2) = dVar1;
        *(undefined8 *)((long)&(out->mValue).x + lVar2) = local_38;
        *(float *)((long)&(out->mValue).z + lVar2) = fVar3;
        lVar2 = lVar2 + 0x18;
      } while ((ulong)size * 0x18 != lVar2);
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVectorKey]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}